

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_lowmc.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  pointer puVar1;
  pointer pdVar2;
  result_type rVar3;
  picnic_instance_t *lowmc;
  lowmc_implementation_f p_Var4;
  mzd_local_t *result;
  mzd_local_t *result_00;
  mzd_local_t *__ptr;
  ulong uVar5;
  long lVar6;
  long lVar7;
  ostream *poVar8;
  int iVar9;
  ulong __n;
  pointer puVar10;
  mzd_local_t *__ptr_00;
  uint uVar11;
  duration<long,_std::ratio<1L,_1000000L>_> *ms;
  pointer pdVar12;
  vector<unsigned_char,_std::allocator<unsigned_char>_> rand_buffer;
  vector<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>_>
  timings;
  default_random_engine eng;
  uniform_int_distribution<unsigned_int> dist;
  random_device rnd;
  ulong len;
  
  parse_args((int)&rnd,(char **)(ulong)(uint)argc);
  if (rnd.field_0._4_4_ == 0) {
    iVar9 = 1;
  }
  else {
    __n = (ulong)rnd.field_0.field_0._M_file & 0xffffffff;
    lowmc = picnic_instance_get(rnd.field_0._4_4_);
    if (lowmc == (picnic_instance_t *)0x0) {
      poVar8 = std::operator<<((ostream *)&std::cout,"Failed to create Picnic instance.");
      std::endl<char,std::char_traits<char>>(poVar8);
    }
    else {
      timings.
      super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      timings.
      super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      timings.
      super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::
      vector<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>_>
      ::reserve(&timings,__n);
      p_Var4 = lowmc_get_implementation(&lowmc->lowmc);
      result = mzd_local_init_ex(1,(uint)(lowmc->lowmc).n,true);
      result_00 = mzd_local_init_ex(1,(uint)(lowmc->lowmc).n,true);
      __ptr = mzd_local_init_ex(1,(uint)(lowmc->lowmc).n,true);
      rand_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      rand_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      rand_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      uVar11 = (lowmc->lowmc).n + 7 >> 3;
      len = (ulong)uVar11;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&rand_buffer,(ulong)(uVar11 * 2));
      dist._M_param._M_a = 0;
      dist._M_param._M_b = 0xff;
      std::random_device::random_device(&rnd);
      uVar5 = std::random_device::_M_getval();
      puVar1 = rand_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_finish;
      iVar9 = (int)((uVar5 & 0xffffffff) % 0x7fffffff);
      eng._M_x = (unsigned_long)(iVar9 + (uint)(iVar9 == 0));
      for (puVar10 = rand_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start; puVar10 != puVar1;
          puVar10 = puVar10 + 1) {
        rVar3 = std::uniform_int_distribution<unsigned_int>::operator()(&dist,&eng);
        *puVar10 = (uchar)rVar3;
      }
      std::random_device::~random_device(&rnd);
      mzd_from_char_array(result,rand_buffer.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,len);
      mzd_from_char_array(result_00,
                          rand_buffer.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start + len,len);
      while (__ptr_00 = result_00, iVar9 = (int)__n, __n = (ulong)(iVar9 - 1), iVar9 != 0) {
        lVar6 = std::chrono::_V2::system_clock::now();
        (*p_Var4)(result,__ptr_00,__ptr);
        lVar7 = std::chrono::_V2::system_clock::now();
        rnd.field_0.field_0._M_file = (void *)((lVar7 - lVar6) / 1000);
        std::
        vector<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000000l>>>>
        ::emplace_back<std::chrono::duration<long,std::ratio<1l,1000000l>>>
                  ((vector<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000000l>>>>
                    *)&timings,(duration<long,_std::ratio<1L,_1000000L>_> *)&rnd);
        result_00 = __ptr;
        __ptr = __ptr_00;
      }
      free(__ptr);
      free(__ptr_00);
      free(result);
      pdVar2 = timings.
               super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pdVar12 = timings.
                     super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pdVar12 != pdVar2;
          pdVar12 = pdVar12 + 1) {
        poVar8 = std::ostream::_M_insert<long>((long)&std::cout);
        std::endl<char,std::char_traits<char>>(poVar8);
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&rand_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      std::
      _Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>_>
      ::~_Vector_base(&timings.
                       super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>_>
                     );
    }
    iVar9 = 0;
  }
  return iVar9;
}

Assistant:

int main(int argc, char** argv) {
  picnic_params_t params;
  unsigned int iter;
  std::tie(params, iter) = parse_args(argc, argv);
  if (params == PARAMETER_SET_INVALID) {
    return 1;
  }

  bench_lowmc(params, iter);
  return 0;
}